

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[42],kj::_::DebugComparison<wchar_t&,wchar_t_const&>&,unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [42],
               DebugComparison<wchar_t_&,_const_wchar_t_&> *params_1,unsigned_long *params_2,
               CappedArray<char,_9UL> *params_3,CappedArray<char,_9UL> *params_4)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  unsigned_long *params_00;
  long lVar5;
  String *result;
  String argValues [5];
  undefined8 in_stack_ffffffffffffff28;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  String local_a8;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[42]>
            (&local_a8,(kj *)params,(char (*) [42])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_c0,params_1);
  local_90 = local_c0;
  local_88 = local_b8;
  uStack_80 = uStack_b0;
  str<unsigned_long&>(&local_78,(kj *)params_2,params_00);
  sVar1 = params_3->currentSize;
  heapString(&local_60,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_60.content.size_ != (char *)0x0) {
      local_60.content.size_ = (size_t)local_60.content.ptr;
    }
    memcpy((void *)local_60.content.size_,params_3->content,sVar1);
  }
  sVar1 = params_4->currentSize;
  heapString(&local_48,sVar1);
  if (sVar1 != 0) {
    if ((char *)local_48.content.size_ != (char *)0x0) {
      local_48.content.size_ = (size_t)local_48.content.ptr;
    }
    memcpy((void *)local_48.content.size_,params_4->content,sVar1);
  }
  argValues_00.size_._0_4_ = line;
  argValues_00.ptr = (String *)in_stack_ffffffffffffff28;
  argValues_00.size_._4_4_ = severity;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_a8,argValues_00);
  lVar5 = 0x60;
  do {
    lVar2 = *(long *)((long)&local_a8.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_a8.content.size_ + lVar5);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_a8.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}